

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_impl_ssse3.c
# Opt level: O2

void aom_var_filter_block2d_bil_first_pass_ssse3
               (uint8_t *a,uint16_t *b,uint src_pixels_per_line,uint pixel_step,uint output_height,
               uint output_width,uint8_t *filter)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  ushort uVar6;
  ushort uVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar7 = pshuflw(ZEXT216(*(ushort *)filter),ZEXT216(*(ushort *)filter),0);
  uVar6 = auVar7._0_2_;
  auVar8._0_2_ = uVar6 >> 1;
  uVar9 = auVar7._2_2_;
  auVar8._2_2_ = uVar9 >> 1;
  auVar8._4_2_ = uVar6 >> 1;
  auVar8._6_2_ = uVar9 >> 1;
  auVar8._8_2_ = uVar6 >> 1;
  auVar8._10_2_ = uVar9 >> 1;
  auVar8._12_2_ = uVar6 >> 1;
  auVar8._14_2_ = uVar9 >> 1;
  auVar8 = auVar8 & _DAT_0042a3c0;
  if (output_width < 8) {
    while (bVar5 = output_height != 0, output_height = output_height - 1, bVar5) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)a;
      auVar7 = pshufb(auVar7,ZEXT816(0x403030202010100));
      auVar7 = pmaddubsw(auVar7,auVar8);
      auVar19._0_2_ = auVar7._0_2_ + 0x20;
      auVar19._2_2_ = auVar7._2_2_ + 0x20;
      auVar19._4_2_ = auVar7._4_2_ + 0x20;
      auVar19._6_2_ = auVar7._6_2_ + 0x20;
      auVar19._8_2_ = auVar7._8_2_ + 0x20;
      auVar19._10_2_ = auVar7._10_2_ + 0x20;
      auVar19._12_2_ = auVar7._12_2_ + 0x20;
      auVar19._14_2_ = auVar7._14_2_ + 0x20;
      auVar7 = psraw(auVar19,6);
      *(long *)b = auVar7._0_8_;
      a = (uint8_t *)((long)a + (ulong)src_pixels_per_line);
      b = b + output_width;
    }
  }
  else {
    for (uVar3 = 0; uVar3 != output_height; uVar3 = uVar3 + 1) {
      for (lVar4 = 0; (uint)lVar4 < output_width; lVar4 = lVar4 + 8) {
        uVar1 = *(ulong *)(a + lVar4);
        uVar2 = *(undefined8 *)(a + lVar4 + 1);
        auVar17._8_6_ = 0;
        auVar17._0_8_ = uVar1;
        auVar17[0xe] = (char)(uVar1 >> 0x38);
        auVar17[0xf] = (char)((ulong)uVar2 >> 0x38);
        auVar16._14_2_ = auVar17._14_2_;
        auVar16._8_5_ = 0;
        auVar16._0_8_ = uVar1;
        auVar16[0xd] = (char)((ulong)uVar2 >> 0x30);
        auVar15._13_3_ = auVar16._13_3_;
        auVar15._8_4_ = 0;
        auVar15._0_8_ = uVar1;
        auVar15[0xc] = (char)(uVar1 >> 0x30);
        auVar14._12_4_ = auVar15._12_4_;
        auVar14._8_3_ = 0;
        auVar14._0_8_ = uVar1;
        auVar14[0xb] = (char)((ulong)uVar2 >> 0x28);
        auVar13._11_5_ = auVar14._11_5_;
        auVar13._8_2_ = 0;
        auVar13._0_8_ = uVar1;
        auVar13[10] = (char)(uVar1 >> 0x28);
        auVar12._10_6_ = auVar13._10_6_;
        auVar12[8] = 0;
        auVar12._0_8_ = uVar1;
        auVar12[9] = (char)((ulong)uVar2 >> 0x20);
        auVar11._9_7_ = auVar12._9_7_;
        auVar11[8] = (char)(uVar1 >> 0x20);
        auVar11._0_8_ = uVar1;
        auVar10._8_8_ = auVar11._8_8_;
        auVar10[7] = (char)((ulong)uVar2 >> 0x18);
        auVar10[6] = (char)(uVar1 >> 0x18);
        auVar10[5] = (char)((ulong)uVar2 >> 0x10);
        auVar10[4] = (char)(uVar1 >> 0x10);
        auVar10[3] = (char)((ulong)uVar2 >> 8);
        auVar10[2] = (char)(uVar1 >> 8);
        auVar10[0] = (undefined1)uVar1;
        auVar10[1] = (char)uVar2;
        auVar7 = pmaddubsw(auVar10,auVar8);
        auVar18._0_2_ = auVar7._0_2_ + 0x20;
        auVar18._2_2_ = auVar7._2_2_ + 0x20;
        auVar18._4_2_ = auVar7._4_2_ + 0x20;
        auVar18._6_2_ = auVar7._6_2_ + 0x20;
        auVar18._8_2_ = auVar7._8_2_ + 0x20;
        auVar18._10_2_ = auVar7._10_2_ + 0x20;
        auVar18._12_2_ = auVar7._12_2_ + 0x20;
        auVar18._14_2_ = auVar7._14_2_ + 0x20;
        auVar7 = psraw(auVar18,6);
        *(undefined1 (*) [16])b = auVar7;
        b = (uint16_t *)((long)b + 0x10);
      }
      a = a + lVar4 + (ulong)(src_pixels_per_line - output_width);
    }
  }
  return;
}

Assistant:

void aom_var_filter_block2d_bil_first_pass_ssse3(
    const uint8_t *a, uint16_t *b, unsigned int src_pixels_per_line,
    unsigned int pixel_step, unsigned int output_height,
    unsigned int output_width, const uint8_t *filter) {
  // Note: filter[0], filter[1] could be {128, 0}, where 128 will overflow
  // in computation using _mm_maddubs_epi16.
  // Change {128, 0} to {64, 0} and reduce FILTER_BITS by 1 to avoid overflow.
  const int16_t round = (1 << (FILTER_BITS - 1)) >> 1;
  const __m128i r = _mm_set1_epi16(round);
  const int8_t f0 = (int8_t)(filter[0] >> 1);
  const int8_t f1 = (int8_t)(filter[1] >> 1);
  const __m128i filters = _mm_setr_epi8(f0, f1, f0, f1, f0, f1, f0, f1, f0, f1,
                                        f0, f1, f0, f1, f0, f1);
  unsigned int i, j;
  (void)pixel_step;

  if (output_width >= 8) {
    for (i = 0; i < output_height; ++i) {
      for (j = 0; j < output_width; j += 8) {
        // load source
        __m128i source_low = xx_loadl_64(a);
        __m128i source_hi = xx_loadl_64(a + 1);

        // unpack to:
        // { a[0], a[1], a[1], a[2], a[2], a[3], a[3], a[4],
        //   a[4], a[5], a[5], a[6], a[6], a[7], a[7], a[8] }
        __m128i source = _mm_unpacklo_epi8(source_low, source_hi);

        // b[i] = a[i] * filter[0] + a[i + 1] * filter[1]
        __m128i res = _mm_maddubs_epi16(source, filters);

        // round
        res = _mm_srai_epi16(_mm_add_epi16(res, r), FILTER_BITS - 1);

        xx_storeu_128(b, res);

        a += 8;
        b += 8;
      }

      a += src_pixels_per_line - output_width;
    }
  } else {
    const __m128i shuffle_mask =
        _mm_setr_epi8(0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8);
    for (i = 0; i < output_height; ++i) {
      // load source, only first 5 values are meaningful:
      // { a[0], a[1], a[2], a[3], a[4], xxxx }
      __m128i source = xx_loadl_64(a);

      // shuffle, up to the first 8 are useful
      // { a[0], a[1], a[1], a[2], a[2], a[3], a[3], a[4],
      //   a[4], a[5], a[5], a[6], a[6], a[7], a[7], a[8] }
      __m128i source_shuffle = _mm_shuffle_epi8(source, shuffle_mask);

      __m128i res = _mm_maddubs_epi16(source_shuffle, filters);
      res = _mm_srai_epi16(_mm_add_epi16(res, r), FILTER_BITS - 1);

      xx_storel_64(b, res);

      a += src_pixels_per_line;
      b += output_width;
    }
  }
}